

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

bool __thiscall cmGraphVizWriter::ItemNameFilteredOut(cmGraphVizWriter *this,string *itemName)

{
  pointer pRVar1;
  bool bVar2;
  int iVar3;
  RegularExpression *regEx;
  pointer this_00;
  bool bVar4;
  
  iVar3 = std::__cxx11::string::compare((char *)itemName);
  bVar4 = true;
  if ((iVar3 != 0) && (bVar2 = cmGlobalGenerator::IsReservedTarget(itemName), !bVar2)) {
    pRVar1 = (this->TargetsToIgnoreRegex).
             super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (this->TargetsToIgnoreRegex).
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar4 = this_00 != pRVar1, bVar4;
        this_00 = this_00 + 1) {
      if ((this_00->program != (char *)0x0) &&
         (bVar2 = cmsys::RegularExpression::find
                            (this_00,(itemName->_M_dataplus)._M_p,&this_00->regmatch), bVar2)) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

bool cmGraphVizWriter::ItemNameFilteredOut(std::string const& itemName)
{
  if (itemName == ">") {
    // FIXME: why do we even receive such a target here?
    return true;
  }

  if (cmGlobalGenerator::IsReservedTarget(itemName)) {
    return true;
  }

  for (cmsys::RegularExpression& regEx : this->TargetsToIgnoreRegex) {
    if (regEx.is_valid()) {
      if (regEx.find(itemName)) {
        return true;
      }
    }
  }

  return false;
}